

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int64_t floatx80_to_int64_mips(floatx80 a,float_status *status)

{
  ushort uVar1;
  uint64_t absZ1;
  int64_t iVar2;
  ulong absZ0;
  ulong uVar3;
  
  uVar3 = a.low;
  uVar1 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar3)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    return -0x8000000000000000;
  }
  if (uVar1 < 0x403e) {
    if (uVar1 < 0x3fff) {
      if (uVar1 == 0x3ffe) {
        absZ0 = 0;
        absZ1 = uVar3;
      }
      else {
        absZ1 = (uint64_t)(uVar3 != 0);
        absZ0 = 0;
      }
    }
    else {
      absZ1 = uVar3 << ((char)uVar1 + 2U & 0x3f);
      absZ0 = uVar3 >> (0x3eU - (char)uVar1 & 0x3f);
    }
  }
  else {
    if (uVar1 != 0x403e) {
      status->float_exception_flags = status->float_exception_flags | 1;
      if ((short)a.high < 0) {
        iVar2 = 0x7fffffffffffffff;
        if (uVar1 != 0x7fff) {
          iVar2 = -0x8000000000000000;
        }
        if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
          iVar2 = -0x8000000000000000;
        }
        return iVar2;
      }
      return 0x7fffffffffffffff;
    }
    absZ0 = uVar3;
    absZ1 = 0;
  }
  iVar2 = roundAndPackInt64((flag)((a._8_8_ & 0xffff) >> 0xf),absZ0,absZ1,status);
  return iVar2;
}

Assistant:

int64_t floatx80_to_int64(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig, aSigExtra;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return 1ULL << 63;
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    shiftCount = 0x403E - aExp;
    if ( shiftCount <= 0 ) {
        if ( shiftCount ) {
            float_raise(float_flag_invalid, status);
            if (!aSign || floatx80_is_any_nan(a)) {
                return INT64_MAX;
            }
            return INT64_MIN;
        }
        aSigExtra = 0;
    }
    else {
        shift64ExtraRightJamming( aSig, 0, shiftCount, &aSig, &aSigExtra );
    }
    return roundAndPackInt64(aSign, aSig, aSigExtra, status);

}